

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_setFperiod(OpenJTalk *oj,uint i)

{
  uint in_ESI;
  long in_RDI;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if (in_ESI == 0) {
      in_ESI = 1;
    }
    *(ulong *)(in_RDI + 0x640) = (ulong)in_ESI;
    Open_JTalk_set_fperiod
              ((Open_JTalk *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setFperiod(OpenJTalk *oj, unsigned int i)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (i < 1)
	{
		i = 1;
	}
	oj->fperiod = i;
	Open_JTalk_set_fperiod(oj->open_jtalk, oj->fperiod);
}